

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlVErrMemory(xmlValidCtxtPtr ctxt)

{
  xmlValidCtxtPtr ctxt_local;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x17,
                        (xmlError *)0x0);
  }
  else if ((ctxt->flags & 2) == 0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,ctxt->error,ctxt->userData,0x17,(xmlError *)0x0)
    ;
  }
  else {
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctxt->userData);
  }
  return;
}

Assistant:

static void
xmlVErrMemory(xmlValidCtxtPtr ctxt)
{
    if (ctxt != NULL) {
        if (ctxt->flags & XML_VCTXT_USE_PCTXT) {
            xmlCtxtErrMemory(ctxt->userData);
        } else {
            xmlRaiseMemoryError(NULL, ctxt->error, ctxt->userData,
                                XML_FROM_VALID, NULL);
        }
    } else {
        xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_VALID, NULL);
    }
}